

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<std::map<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>,std::map<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>>
                   (map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>
                    *lhs,char *op,
                   map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_> *rhs
                   )

{
  String *in_RDI;
  map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>
  *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>,_true>
            (in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<std::map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>,_true>
            (in_stack_ffffffffffffff58);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }